

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# problem-test.cc
# Opt level: O3

void __thiscall ProblemTest_CompareVars_Test::TestBody(ProblemTest_CompareVars_Test *this)

{
  bool bVar1;
  char *in_R9;
  MutVariable MVar2;
  BasicVariable<mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
  BVar3;
  AssertionResult gtest_ar_;
  Problem p;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_3a0;
  AssertHelper local_398;
  internal local_390 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_388;
  undefined1 local_380 [32];
  BasicProblem<mp::BasicProblemParams<int>_> local_360;
  
  mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicProblem(&local_360);
  mp::BasicProblem<mp::BasicProblemParams<int>_>::AddVar(&local_360,0.0,0.0,CONTINUOUS);
  mp::BasicProblem<mp::BasicProblemParams<int>_>::AddVar(&local_360,0.0,0.0,CONTINUOUS);
  MVar2 = mp::BasicProblem<mp::BasicProblemParams<int>_>::var(&local_360,0);
  local_380._0_8_ =
       MVar2.
       super_BasicVariable<mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
       .super_BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>.problem_;
  local_380._8_4_ =
       MVar2.
       super_BasicVariable<mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
       .super_BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>.index_;
  BVar3.super_BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_> =
       (BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>)
       mp::BasicProblem<mp::BasicProblemParams<int>_>::var(&local_360,0);
  local_390[0] = (internal)
                 mp::BasicProblem<mp::BasicProblemParams<int>>::
                 BasicVariable<mp::BasicProblem<mp::BasicProblemParams<int>>::BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>>>>
                 ::operator==((BasicVariable<mp::BasicProblem<mp::BasicProblemParams<int>>::BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>>>>
                               *)local_380,BVar3);
  local_388.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (!(bool)local_390[0]) {
    testing::Message::Message((Message *)&local_3a0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_380,local_390,(AssertionResult *)"p.var(0) == p.var(0)","false",
               "true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_398,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/problem-test.cc",
               0x7a,(char *)local_380._0_8_);
    testing::internal::AssertHelper::operator=(&local_398,(Message *)&local_3a0);
    testing::internal::AssertHelper::~AssertHelper(&local_398);
    if ((BasicProblem<mp::BasicProblemParams<int>_> *)local_380._0_8_ !=
        (BasicProblem<mp::BasicProblemParams<int>_> *)(local_380 + 0x10)) {
      operator_delete((void *)local_380._0_8_,local_380._16_8_ + 1);
    }
    if (local_3a0.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         (local_3a0.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_3a0.ptr_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_388,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  MVar2 = mp::BasicProblem<mp::BasicProblemParams<int>_>::var(&local_360,0);
  local_380._0_8_ =
       MVar2.
       super_BasicVariable<mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
       .super_BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>.problem_;
  local_380._8_4_ =
       MVar2.
       super_BasicVariable<mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
       .super_BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>.index_;
  BVar3.super_BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_> =
       (BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>)
       mp::BasicProblem<mp::BasicProblemParams<int>_>::var(&local_360,1);
  bVar1 = mp::BasicProblem<mp::BasicProblemParams<int>>::
          BasicVariable<mp::BasicProblem<mp::BasicProblemParams<int>>::BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>>>>
          ::operator==((BasicVariable<mp::BasicProblem<mp::BasicProblemParams<int>>::BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>>>>
                        *)local_380,BVar3);
  local_390[0] = (internal)!bVar1;
  local_388.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (bVar1) {
    testing::Message::Message((Message *)&local_3a0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_380,local_390,(AssertionResult *)"p.var(0) != p.var(1)","false",
               "true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_398,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/problem-test.cc",
               0x7b,(char *)local_380._0_8_);
    testing::internal::AssertHelper::operator=(&local_398,(Message *)&local_3a0);
    testing::internal::AssertHelper::~AssertHelper(&local_398);
    if ((BasicProblem<mp::BasicProblemParams<int>_> *)local_380._0_8_ !=
        (BasicProblem<mp::BasicProblemParams<int>_> *)(local_380 + 0x10)) {
      operator_delete((void *)local_380._0_8_,local_380._16_8_ + 1);
    }
    if (local_3a0.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         (local_3a0.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_3a0.ptr_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_388,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  MVar2 = mp::BasicProblem<mp::BasicProblemParams<int>_>::var(&local_360,0);
  local_380._0_8_ =
       MVar2.
       super_BasicVariable<mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
       .super_BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>.problem_;
  local_380._8_4_ =
       MVar2.
       super_BasicVariable<mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
       .super_BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>.index_;
  BVar3.super_BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_> =
       (BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>)
       mp::BasicProblem<mp::BasicProblemParams<int>_>::var(&local_360,0);
  local_390[0] = (internal)
                 mp::BasicProblem<mp::BasicProblemParams<int>>::
                 BasicVariable<mp::BasicProblem<mp::BasicProblemParams<int>>::BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>>>>
                 ::operator==((BasicVariable<mp::BasicProblem<mp::BasicProblemParams<int>>::BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>>>>
                               *)local_380,BVar3);
  local_388.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (!(bool)local_390[0]) {
    testing::Message::Message((Message *)&local_3a0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_380,local_390,(AssertionResult *)"p.var(0) != p.var(0)","true",
               "false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_398,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/problem-test.cc",
               0x7c,(char *)local_380._0_8_);
    testing::internal::AssertHelper::operator=(&local_398,(Message *)&local_3a0);
    testing::internal::AssertHelper::~AssertHelper(&local_398);
    if ((BasicProblem<mp::BasicProblemParams<int>_> *)local_380._0_8_ !=
        (BasicProblem<mp::BasicProblemParams<int>_> *)(local_380 + 0x10)) {
      operator_delete((void *)local_380._0_8_,local_380._16_8_ + 1);
    }
    if (local_3a0.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         (local_3a0.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_3a0.ptr_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_388,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  MVar2 = mp::BasicProblem<mp::BasicProblemParams<int>_>::var(&local_360,0);
  local_380._0_8_ =
       MVar2.
       super_BasicVariable<mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
       .super_BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>.problem_;
  local_380._8_4_ =
       MVar2.
       super_BasicVariable<mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
       .super_BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>.index_;
  BVar3.super_BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_> =
       (BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>)
       mp::BasicProblem<mp::BasicProblemParams<int>_>::var(&local_360,1);
  bVar1 = mp::BasicProblem<mp::BasicProblemParams<int>>::
          BasicVariable<mp::BasicProblem<mp::BasicProblemParams<int>>::BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>>>>
          ::operator==((BasicVariable<mp::BasicProblem<mp::BasicProblemParams<int>>::BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>>>>
                        *)local_380,BVar3);
  local_390[0] = (internal)!bVar1;
  local_388.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (bVar1) {
    testing::Message::Message((Message *)&local_3a0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_380,local_390,(AssertionResult *)"p.var(0) == p.var(1)","true",
               "false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_398,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/problem-test.cc",
               0x7d,(char *)local_380._0_8_);
    testing::internal::AssertHelper::operator=(&local_398,(Message *)&local_3a0);
    testing::internal::AssertHelper::~AssertHelper(&local_398);
    if ((BasicProblem<mp::BasicProblemParams<int>_> *)local_380._0_8_ !=
        (BasicProblem<mp::BasicProblemParams<int>_> *)(local_380 + 0x10)) {
      operator_delete((void *)local_380._0_8_,local_380._16_8_ + 1);
    }
    if (local_3a0.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         (local_3a0.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_3a0.ptr_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_388,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  mp::BasicProblem<mp::BasicProblemParams<int>_>::~BasicProblem(&local_360);
  return;
}

Assistant:

TEST(ProblemTest, CompareVars) {
  Problem p;
  p.AddVar(0, 0);
  p.AddVar(0, 0);
  EXPECT_TRUE(p.var(0) == p.var(0));
  EXPECT_TRUE(p.var(0) != p.var(1));
  EXPECT_FALSE(p.var(0) != p.var(0));
  EXPECT_FALSE(p.var(0) == p.var(1));
}